

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  Printer *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  char *in_RCX;
  string_view s;
  string *local_c0;
  string_view local_98 [2];
  undefined1 local_78 [16];
  string *local_68;
  string local_60;
  iterator local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char *format_local;
  Formatter *this_local;
  
  this_00 = this->printer_;
  local_68 = &local_60;
  local_20 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)format;
  format_local = (char *)this;
  local_78 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)args);
  s._M_len = local_78._8_8_;
  s._M_str = in_RCX;
  ToString_abi_cxx11_(&local_60,local_78._0_8_,s);
  local_40 = &local_60;
  local_38 = 1;
  v._M_len = 1;
  v._M_array = local_40;
  absl::lts_20250127::Span<std::__cxx11::string_const>::
  Span<std::__cxx11::string_const,std::__cxx11::string_const>
            ((Span<std::__cxx11::string_const> *)local_30._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_98,(char *)args_local);
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,(Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_30,&this->vars_,local_98[0]);
  local_c0 = (string *)&local_40;
  do {
    local_c0 = local_c0 + -1;
    std::__cxx11::string::~string((string *)local_c0);
  } while (local_c0 != &local_60);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }